

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_serializer.cpp
# Opt level: O1

void net_serializer<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_void>
     ::serialize(ostream *out,
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *data)

{
  pointer pvVar1;
  undefined4 in_EAX;
  size_t i;
  long lVar2;
  vector<double,_std::allocator<double>_> *i_1;
  pointer data_00;
  uint8_t buf [4];
  undefined4 uStack_28;
  int local_24;
  
  _uStack_28 = CONCAT44((int)((ulong)((long)(data->
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(data->
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x55555555,in_EAX);
  lVar2 = 0;
  do {
    uStack_28 = CONCAT13(*(undefined1 *)((long)&local_24 + lVar2),(undefined3)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_28 + 3),1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pvVar1 = (data->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (data_00 = (data->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; data_00 != pvVar1;
      data_00 = data_00 + 1) {
    net_serializer<std::vector<double,_std::allocator<double>_>,_void>::serialize(out,data_00);
  }
  return;
}

Assistant:

static void serialize(std::ostream& out, const std::vector<T>& data){
        net_serializer<int>::serialize(out, data.size());
        for (const auto& i:data)
            net_serializer<T>::serialize(out, i);
    }